

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int eoserv_main(int argc,char **argv)

{
  TimeEvent *pTVar1;
  bool bVar2;
  int iVar3;
  int backlog;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  mapped_type *pmVar7;
  tm *ptVar8;
  reference pvVar9;
  undefined8 uVar10;
  time_t tVar11;
  reference pvVar12;
  ulong uVar13;
  char *pcVar14;
  FILE *pFVar15;
  Socket_Exception *e;
  Database_Exception *e_1;
  runtime_error *e_2;
  logic_error *e_3;
  exception *e_4;
  key_type local_c00;
  undefined1 local_be0 [8];
  string logout;
  key_type local_bb8;
  undefined1 local_b98 [8];
  string logerr;
  char timestr_1 [256];
  time_t rawtime_1;
  key_type local_a68;
  undefined1 local_a48 [8];
  string old_logout;
  key_type local_a20;
  undefined1 local_a00 [8];
  string old_logerr;
  Database_Exception *e_8;
  key_type local_9d0;
  string local_9b0;
  Database_Exception *e_7;
  key_type local_980;
  allocator<char> local_959;
  key_type local_958;
  allocator<char> local_931;
  key_type local_930;
  allocator<char> local_909;
  key_type local_908;
  allocator<char> local_8e1;
  key_type local_8e0;
  allocator<char> local_8b9;
  key_type local_8b8;
  allocator<char> local_891;
  key_type local_890;
  allocator<char> local_869;
  key_type local_868;
  undefined1 local_848 [8];
  Database_Result ban_perm_count;
  Database_Result ban_active_count;
  Database_Result ban_count;
  Database_Result guild_count;
  Database_Result admin_character_count;
  Database_Result character_count;
  Database_Result acc_count;
  undefined1 local_760 [4];
  bool try_install;
  bool tried_install;
  bool tables_exist;
  allocator<char> local_739;
  key_type local_738;
  string local_718;
  allocator<char> local_6f1;
  key_type local_6f0;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
  local_6d0;
  allocator<char> local_609;
  key_type local_608;
  allocator<char> local_5e1;
  key_type local_5e0;
  string local_5c0;
  IPAddress local_59c;
  undefined1 local_598 [8];
  EOServer server;
  key_type local_4e0;
  string local_4c0;
  allocator<char> local_499;
  key_type local_498;
  string local_478;
  allocator<char> local_451;
  key_type local_450;
  string local_430;
  allocator<char> local_409;
  key_type local_408;
  string local_3e8;
  allocator<char> local_3c1;
  key_type local_3c0;
  string local_3a0;
  allocator<char> local_379;
  key_type local_378;
  string local_358;
  undefined1 local_338 [8];
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL> dbinfo
  ;
  anon_class_16_2_9338228d redirect_stream;
  char timestr [256];
  time_t rawtime;
  key_type local_158;
  runtime_error *e_6;
  string local_128;
  runtime_error *e_5;
  string local_f8;
  undefined1 local_d8 [8];
  Config aconfig;
  undefined1 local_70 [8];
  Config config;
  char **argv_local;
  int argc_local;
  
  config.filename.field_2._8_8_ = argv;
  exception_test();
  signal(1,eoserv_rehash);
  signal(6,eoserv_terminate);
  signal(0xf,eoserv_terminate);
  signal(2,eoserv_terminate);
  signal(0xb,eoserv_crash);
  signal(8,eoserv_crash);
  signal(7,eoserv_crash);
  signal(4,eoserv_crash);
  Config::Config((Config *)local_70);
  Config::Config((Config *)local_d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"config.ini",(allocator<char> *)((long)&e_5 + 7));
  Config::Read((Config *)local_70,&local_f8,false);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_5 + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"admin.ini",(allocator<char> *)((long)&e_6 + 7));
  Config::Read((Config *)local_d8,&local_128,false);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_6 + 7));
  eoserv_config_validate_config((Config *)local_70);
  eoserv_config_validate_admin((Config *)local_d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"StyleConsole",(allocator<char> *)((long)&rawtime + 7));
  pmVar7 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         *)local_70,&local_158);
  Console::Styled = util::variant::operator_cast_to_bool(pmVar7);
  DAT_002c66b9 = Console::Styled;
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)((long)&rawtime + 7));
  puts(
      "                          ___ ___  ___ ___ _____   __\n   EOSERV Version 0.7.0  | __/ _ \\/ __| __| _ \\ \\ / /    http://eoserv.net/\n=========================| _| (_) \\__ \\ _||   /\\ ` /===========================\n                         |___\\___/|___/___|_|_\\ \\_/ Copyright (c) Julian Smythe\n\n"
      );
  time((time_t *)(timestr + 0xf8));
  ptVar8 = localtime((time_t *)(timestr + 0xf8));
  strftime((char *)&redirect_stream.timestr,0x100,"%c",ptVar8);
  dbinfo._M_elems[5].field_2._8_8_ = local_70;
  redirect_stream.config = (Config *)&redirect_stream.timestr;
  eoserv_main::anon_class_16_2_9338228d::operator()
            ((anon_class_16_2_9338228d *)((long)&dbinfo._M_elems[5].field_2 + 8),"errors",
             (FILE *)_stderr,STREAM_ERR,"LogErr");
  eoserv_main::anon_class_16_2_9338228d::operator()
            ((anon_class_16_2_9338228d *)((long)&dbinfo._M_elems[5].field_2 + 8),"output",
             (FILE *)_stdout,STREAM_OUT,"LogOut");
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>::
  array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
         *)local_338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"DBType",&local_379);
  pmVar7 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         *)local_70,&local_378);
  util::variant::operator_cast_to_string(&local_358,pmVar7);
  pvVar9 = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
           ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
                         *)local_338,0);
  std::__cxx11::string::operator=((string *)pvVar9,(string *)&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"DBHost",&local_3c1);
  pmVar7 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         *)local_70,&local_3c0);
  util::variant::operator_cast_to_string(&local_3a0,pmVar7);
  pvVar9 = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
           ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
                         *)local_338,1);
  std::__cxx11::string::operator=((string *)pvVar9,(string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_408,"DBUser",&local_409);
  pmVar7 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         *)local_70,&local_408);
  util::variant::operator_cast_to_string(&local_3e8,pmVar7);
  pvVar9 = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
           ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
                         *)local_338,2);
  std::__cxx11::string::operator=((string *)pvVar9,(string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator(&local_409);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_450,"DBPass",&local_451);
  pmVar7 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         *)local_70,&local_450);
  util::variant::operator_cast_to_string(&local_430,pmVar7);
  pvVar9 = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
           ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
                         *)local_338,3);
  std::__cxx11::string::operator=((string *)pvVar9,(string *)&local_430);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator(&local_451);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_498,"DBName",&local_499);
  pmVar7 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         *)local_70,&local_498);
  util::variant::operator_cast_to_string(&local_478,pmVar7);
  pvVar9 = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
           ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
                         *)local_338,4);
  std::__cxx11::string::operator=((string *)pvVar9,(string *)&local_478);
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator(&local_499);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e0,"DBPort",(allocator<char> *)((long)&server.HangupDelay + 7));
  pmVar7 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         *)local_70,&local_4e0);
  util::variant::operator_cast_to_string(&local_4c0,pmVar7);
  pvVar9 = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
           ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
                         *)local_338,5);
  std::__cxx11::string::operator=((string *)pvVar9,(string *)&local_4c0);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&server.HangupDelay + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5e0,"Host",&local_5e1);
  pmVar7 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         *)local_70,&local_5e0);
  util::variant::operator_cast_to_string(&local_5c0,pmVar7);
  IPAddress::IPAddress(&local_59c,&local_5c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_608,"Port",&local_609);
  pmVar7 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         *)local_70,&local_608);
  iVar3 = util::variant::operator_cast_to_int(pmVar7);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>::
  array(&local_6d0,
        (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
         *)local_338);
  EOServer::EOServer((EOServer *)local_598,local_59c,(unsigned_short)iVar3,&local_6d0,
                     (Config *)local_70,(Config *)local_d8);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>::
  ~array(&local_6d0);
  std::__cxx11::string::~string((string *)&local_608);
  std::allocator<char>::~allocator(&local_609);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::allocator<char>::~allocator(&local_5e1);
  iVar3 = Server::MaxConnections((Server *)local_598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6f0,"ListenBacklog",&local_6f1);
  pmVar7 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         *)local_70,&local_6f0);
  backlog = util::variant::operator_cast_to_int(pmVar7);
  Server::Listen((Server *)local_598,iVar3,backlog);
  std::__cxx11::string::~string((string *)&local_6f0);
  std::allocator<char>::~allocator(&local_6f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_738,"Host",&local_739);
  pmVar7 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         *)local_70,&local_738);
  util::variant::operator_cast_to_string(&local_718,pmVar7);
  uVar10 = std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_760,"Port",(allocator<char> *)&acc_count.field_0x1f);
  pmVar7 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         *)local_70,(key_type *)local_760);
  uVar4 = util::variant::operator_cast_to_int(pmVar7);
  uVar5 = Server::MaxConnections((Server *)local_598);
  Console::Out("Listening on %s:%i (0/%i connections)",uVar10,(ulong)uVar4,(ulong)uVar5);
  std::__cxx11::string::~string((string *)local_760);
  std::allocator<char>::~allocator((allocator<char> *)&acc_count.field_0x1f);
  std::__cxx11::string::~string((string *)&local_718);
  std::__cxx11::string::~string((string *)&local_738);
  std::allocator<char>::~allocator(&local_739);
  acc_count._30_1_ = 0;
  acc_count._29_1_ = 0;
  while (((acc_count._30_1_ ^ 0xff) & 1) != 0) {
    acc_count.error = false;
    Database::Query((Database_Result *)&character_count.affected_rows,
                    (Database *)&server.ping_timer[2].lifetime,
                    "SELECT COUNT(1) AS `count` FROM `accounts`");
    Database::Query((Database_Result *)&admin_character_count.affected_rows,
                    (Database *)&server.ping_timer[2].lifetime,
                    "SELECT COUNT(1) AS `count` FROM `characters`");
    Database::Query((Database_Result *)&guild_count.affected_rows,
                    (Database *)&server.ping_timer[2].lifetime,
                    "SELECT COUNT(1) AS `count` FROM `characters` WHERE `admin` > 0");
    Database::Query((Database_Result *)&ban_count.affected_rows,
                    (Database *)&server.ping_timer[2].lifetime,
                    "SELECT COUNT(1) AS `count` FROM `guilds`");
    Database::Query((Database_Result *)&ban_active_count.affected_rows,
                    (Database *)&server.ping_timer[2].lifetime,
                    "SELECT COUNT(1) AS `count` FROM `bans`");
    pTVar1 = server.ping_timer + 2;
    tVar11 = time((time_t *)0x0);
    Database::Query((Database_Result *)&ban_perm_count.affected_rows,(Database *)&pTVar1->lifetime,
                    "SELECT COUNT(1) AS `count` FROM `bans` WHERE `expires` <= # AND `expires` <> 0"
                    ,tVar11);
    Database::Query((Database_Result *)local_848,(Database *)&server.ping_timer[2].lifetime,
                    "SELECT COUNT(1) AS `count` FROM `bans` WHERE `expires` = 0");
    Console::Out("Database info:");
    pvVar12 = std::
              vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
              ::front((vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
                       *)&character_count.affected_rows);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_868,"count",&local_869);
    pmVar7 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](pvVar12,&local_868);
    uVar4 = util::variant::operator_cast_to_int(pmVar7);
    Console::Out("  Accounts:   %i",(ulong)uVar4);
    std::__cxx11::string::~string((string *)&local_868);
    std::allocator<char>::~allocator(&local_869);
    pvVar12 = std::
              vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
              ::front((vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
                       *)&admin_character_count.affected_rows);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_890,"count",&local_891);
    pmVar7 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](pvVar12,&local_890);
    uVar4 = util::variant::operator_cast_to_int(pmVar7);
    pvVar12 = std::
              vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
              ::front((vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
                       *)&guild_count.affected_rows);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_8b8,"count",&local_8b9);
    pmVar7 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](pvVar12,&local_8b8);
    uVar5 = util::variant::operator_cast_to_int(pmVar7);
    Console::Out("  Characters: %i (%i staff)",(ulong)uVar4,(ulong)uVar5);
    std::__cxx11::string::~string((string *)&local_8b8);
    std::allocator<char>::~allocator(&local_8b9);
    std::__cxx11::string::~string((string *)&local_890);
    std::allocator<char>::~allocator(&local_891);
    pvVar12 = std::
              vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
              ::front((vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
                       *)&ban_count.affected_rows);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_8e0,"count",&local_8e1);
    pmVar7 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](pvVar12,&local_8e0);
    uVar4 = util::variant::operator_cast_to_int(pmVar7);
    Console::Out("  Guilds:     %i",(ulong)uVar4);
    std::__cxx11::string::~string((string *)&local_8e0);
    std::allocator<char>::~allocator(&local_8e1);
    pvVar12 = std::
              vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
              ::front((vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
                       *)&ban_active_count.affected_rows);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_908,"count",&local_909);
    pmVar7 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](pvVar12,&local_908);
    uVar4 = util::variant::operator_cast_to_int(pmVar7);
    pvVar12 = std::
              vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
              ::front((vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
                       *)&ban_perm_count.affected_rows);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_930,"count",&local_931);
    pmVar7 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](pvVar12,&local_930);
    uVar5 = util::variant::operator_cast_to_int(pmVar7);
    pvVar12 = std::
              vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
              ::front((vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
                       *)local_848);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_958,"count",&local_959);
    pmVar7 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](pvVar12,&local_958);
    uVar6 = util::variant::operator_cast_to_int(pmVar7);
    Console::Out("  Bans:       %i (%i expired, %i permanent)",(ulong)uVar4,(ulong)uVar5,
                 (ulong)uVar6);
    std::__cxx11::string::~string((string *)&local_958);
    std::allocator<char>::~allocator(&local_959);
    std::__cxx11::string::~string((string *)&local_930);
    std::allocator<char>::~allocator(&local_931);
    std::__cxx11::string::~string((string *)&local_908);
    std::allocator<char>::~allocator(&local_909);
    pTVar1 = server.ping_timer;
    pvVar12 = std::
              vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
              ::front((vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
                       *)&guild_count.affected_rows);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_980,"count",(allocator<char> *)((long)&e_7 + 7));
    pmVar7 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](pvVar12,&local_980);
    iVar3 = util::variant::operator_cast_to_int(pmVar7);
    World::UpdateAdminCount((World *)pTVar1,iVar3);
    std::__cxx11::string::~string((string *)&local_980);
    std::allocator<char>::~allocator((allocator<char> *)((long)&e_7 + 7));
    acc_count._30_1_ = 1;
    Database_Result::~Database_Result((Database_Result *)local_848);
    Database_Result::~Database_Result((Database_Result *)&ban_perm_count.affected_rows);
    Database_Result::~Database_Result((Database_Result *)&ban_active_count.affected_rows);
    Database_Result::~Database_Result((Database_Result *)&ban_count.affected_rows);
    Database_Result::~Database_Result((Database_Result *)&guild_count.affected_rows);
    Database_Result::~Database_Result((Database_Result *)&admin_character_count.affected_rows);
    Database_Result::~Database_Result((Database_Result *)&character_count.affected_rows);
    if ((acc_count.error & 1U) != 0) {
      acc_count._29_1_ = 1;
      Console::Wrn("A required table is missing. Attempting to execute install.sql");
      World::CommitDB((World *)server.ping_timer);
      pTVar1 = server.ping_timer + 2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_9d0,"InstallSQL",(allocator<char> *)((long)&e_8 + 7));
      pmVar7 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
               ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                             *)local_70,&local_9d0);
      util::variant::operator_cast_to_string(&local_9b0,pmVar7);
      Database::ExecuteFile((Database *)&pTVar1->lifetime,&local_9b0);
      std::__cxx11::string::~string((string *)&local_9b0);
      std::__cxx11::string::~string((string *)&local_9d0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&e_8 + 7));
      World::BeginDB((World *)server.ping_timer);
    }
  }
  do {
    if ((eoserv_running & 1U) == 0) {
LAB_001d1ff5:
      EOServer::~EOServer((EOServer *)local_598);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>::
      ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
              *)local_338);
      Config::~Config((Config *)local_d8);
      Config::~Config((Config *)local_70);
      return 0;
    }
    if (eoserv_sig_abort != 0) {
      Console::Out("Exiting EOSERV");
      eoserv_sig_abort = 0;
      goto LAB_001d1ff5;
    }
    if (eoserv_sig_rehash != 0) {
      Console::Out("Reloading config");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a20,"LogErr",
                 (allocator<char> *)(old_logout.field_2._M_local_buf + 0xf));
      pmVar7 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
               ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                             *)local_70,&local_a20);
      util::variant::operator_cast_to_string((string *)local_a00,pmVar7);
      std::__cxx11::string::~string((string *)&local_a20);
      std::allocator<char>::~allocator((allocator<char> *)(old_logout.field_2._M_local_buf + 0xf));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a68,"LogOut",(allocator<char> *)((long)&rawtime_1 + 7));
      pmVar7 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
               ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                             *)local_70,&local_a68);
      util::variant::operator_cast_to_string((string *)local_a48,pmVar7);
      std::__cxx11::string::~string((string *)&local_a68);
      std::allocator<char>::~allocator((allocator<char> *)((long)&rawtime_1 + 7));
      eoserv_sig_rehash = 0;
      World::Rehash((World *)server.ping_timer);
      time((time_t *)(timestr_1 + 0xf8));
      ptVar8 = localtime((time_t *)(timestr_1 + 0xf8));
      strftime(logerr.field_2._M_local_buf + 8,0x100,"%c",ptVar8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_bb8,"LogErr",
                 (allocator<char> *)(logout.field_2._M_local_buf + 0xf));
      pmVar7 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
               ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                             *)local_70,&local_bb8);
      util::variant::operator_cast_to_string((string *)local_b98,pmVar7);
      std::__cxx11::string::~string((string *)&local_bb8);
      std::allocator<char>::~allocator((allocator<char> *)(logout.field_2._M_local_buf + 0xf));
      uVar13 = std::__cxx11::string::empty();
      if (((uVar13 & 1) == 0) && (iVar3 = std::__cxx11::string::compare(local_b98), iVar3 != 0)) {
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_b98,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_a00);
        if (bVar2) {
          uVar10 = std::__cxx11::string::c_str();
          Console::Out("Redirecting errors to \'%s\'...",uVar10);
        }
        pcVar14 = (char *)std::__cxx11::string::c_str();
        pFVar15 = freopen(pcVar14,"a",_stderr);
        if (pFVar15 == (FILE *)0x0) {
          Console::Err("Failed to redirect errors.");
        }
        else {
          DAT_002c66b9 = 0;
          fprintf(_stderr,"\n\n--- %s ---\n\n",(undefined1 *)((long)&logerr.field_2 + 8));
        }
        iVar3 = setvbuf(_stderr,(char *)0x0,2,0x2000);
        if (iVar3 != 0) {
          Console::Wrn("Failed to change stderr buffer settings");
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c00,"LogOut",(allocator<char> *)((long)&e_4 + 7));
      pmVar7 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
               ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                             *)local_70,&local_c00);
      util::variant::operator_cast_to_string((string *)local_be0,pmVar7);
      std::__cxx11::string::~string((string *)&local_c00);
      std::allocator<char>::~allocator((allocator<char> *)((long)&e_4 + 7));
      uVar13 = std::__cxx11::string::empty();
      if (((uVar13 & 1) == 0) && (iVar3 = std::__cxx11::string::compare(local_be0), iVar3 != 0)) {
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_be0,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_a48);
        if (bVar2) {
          uVar10 = std::__cxx11::string::c_str();
          Console::Out("Redirecting output to \'%s\'...",uVar10);
        }
        pcVar14 = (char *)std::__cxx11::string::c_str();
        pFVar15 = freopen(pcVar14,"a",_stdout);
        if (pFVar15 == (FILE *)0x0) {
          Console::Err("Failed to redirect output.");
        }
        else {
          Console::Styled = 0;
          printf("\n\n--- %s ---\n\n",(undefined1 *)((long)&logerr.field_2 + 8));
        }
        iVar3 = setvbuf(_stdout,(char *)0x0,2,0x2000);
        if (iVar3 != 0) {
          Console::Wrn("Failed to change stdout buffer settings");
        }
      }
      std::__cxx11::string::~string((string *)local_be0);
      std::__cxx11::string::~string((string *)local_b98);
      Console::Out("Config reloaded");
      std::__cxx11::string::~string((string *)local_a48);
      std::__cxx11::string::~string((string *)local_a00);
    }
    EOServer::Tick((EOServer *)local_598);
  } while( true );
}

Assistant:

int eoserv_main(int argc, char *argv[])
{
	(void)argc;
	(void)argv;

	// Type checks
	if (!std::numeric_limits<char>::is_signed) Console::Wrn("char is not signed, correct operation of the server cannot be guaranteed.");

	exception_test();

#ifdef WIN32
	if (argc >= 2)
	{
		std::string mode(argv[1]);
		std::string name = "EOSERV";
		bool silent = false;

		if (argc >= 3)
		{
			name = argv[2];
		}

		if (argc >= 4)
		{
			if (std::string(argv[3]) == "silent")
			{
				silent = true;
			}
		}

		if (mode == "service")
		{
			char cwd[MAX_PATH];
			GetModuleFileName(0, cwd, MAX_PATH);

			char *lastslash = 0;

			for (char *p = cwd; *p != '\0'; ++p)
			{
				if (*p == '\\' || *p == '/')
				{
					lastslash = p;
				}
			}

			if (lastslash)
			{
				*(lastslash+1) = '\0';
			}

			SetCurrentDirectory(cwd);
			service_init(name.c_str());
		}
		else if (mode == "install")
		{
			if (service_install(name.c_str()))
			{
				if (!silent) MessageBox(0, "Service installed.", "EOSERV", MB_OK);
				return 0;
			}
			else
			{
				if (!silent) MessageBox(0, OSErrorString(), "EOSERV", MB_OK);
				return 1;
			}
		}
		else if (mode == "uninstall")
		{
			if (service_uninstall(name.c_str()))
			{
				if (!silent) MessageBox(0, "Service uninstalled.", "EOSERV", MB_OK);
				return 0;
			}
			else
			{
				if (!silent) MessageBox(0, OSErrorString(), "EOSERV", MB_OK);
				return 1;
			}
		}

		return 0;
	}
#endif // WIN32

#ifdef SIGHUP
	std::signal(SIGHUP, eoserv_rehash);
#endif // SIGHUP

	std::signal(SIGABRT, eoserv_terminate);
	std::signal(SIGTERM, eoserv_terminate);
	std::signal(SIGINT, eoserv_terminate);

#ifndef DEBUG
	std::signal(SIGSEGV, eoserv_crash);
	std::signal(SIGFPE, eoserv_crash);
#ifdef SIGBUS
	std::signal(SIGBUS, eoserv_crash);
#endif // SIGBUS
	std::signal(SIGILL, eoserv_crash);
#endif

#ifdef WIN32
	eoserv_close_event = CreateEvent(NULL, FALSE, FALSE, NULL);

	SetConsoleTitle("EOSERV");

	if (!SetConsoleCtrlHandler(static_cast<PHANDLER_ROUTINE>(eoserv_win_event_handler), TRUE))
	{
		Console::Err("Could not install Windows console event handler");
		Console::Err("$shutdown must be used to exit the server cleanly");
	}
#endif // WIN32

#ifndef DEBUG_EXCEPTIONS
	try
	{
#endif // DEBUG_EXCEPTIONS
		Config config, aconfig;

		try
		{
			config.Read("config.ini");
		}
		catch (std::runtime_error &e)
		{
			Console::Wrn("Could not load config.ini - using defaults");
		}

		try
		{
			aconfig.Read("admin.ini");
		}
		catch (std::runtime_error &e)
		{
			Console::Err("Could not load admin.ini - using defaults");
		}

		eoserv_config_validate_config(config);
		eoserv_config_validate_admin(aconfig);

		Console::Styled[1] = Console::Styled[0] = config["StyleConsole"];

		std::puts("\
                          ___ ___  ___ ___ _____   __\n\
   EOSERV Version " EOSERV_VERSION_STRING "  | __/ _ \\/ __| __| _ \\ \\ / /    http://eoserv.net/\n\
=========================| _| (_) \\__ \\ _||   /\\ ` /===========================\n\
                         |___\\___/|___/___|_|_\\ \\_/ Copyright (c) Julian Smythe\n\
\n");
#ifdef DEBUG
		Console::Wrn("This is a debug build and shouldn't be used for live servers.");
#endif

		{
			std::time_t rawtime;
			char timestr[256];
			std::time(&rawtime);
			std::strftime(timestr, 256, "%c", std::localtime(&rawtime));

			auto redirect_stream = [&](const char* name, FILE* fh, Console::Stream stream_id, const char* cfgkey)
			{
				std::string log = config[cfgkey];

				if (!log.empty() && log.compare("-") != 0)
				{
					Console::Out("Redirecting %s to '%s'...", name, log.c_str());

					if (!std::freopen(log.c_str(), "a", fh))
					{
						Console::Err("Failed to redirect %s.", name);
					}
					else
					{
						Console::Styled[stream_id] = false;
						std::fprintf(fh, "\n\n--- %s ---\n\n", timestr);
					}
				}

				if (std::setvbuf(fh, 0, _IOLBF, BUFSIZ) != 0)
					Console::Wrn("Failed to change %s buffer settings", name);
			};

			redirect_stream("errors", stderr, Console::STREAM_ERR, "LogErr");
			redirect_stream("output", stdout, Console::STREAM_OUT, "LogOut");
		}

		std::array<std::string, 6> dbinfo;
		dbinfo[0] = std::string(config["DBType"]);
		dbinfo[1] = std::string(config["DBHost"]);
		dbinfo[2] = std::string(config["DBUser"]);
		dbinfo[3] = std::string(config["DBPass"]);
		dbinfo[4] = std::string(config["DBName"]);
		dbinfo[5] = std::string(config["DBPort"]);

		EOServer server(static_cast<std::string>(config["Host"]), static_cast<int>(config["Port"]), dbinfo, config, aconfig);
		server.Listen(server.MaxConnections(), int(config["ListenBacklog"]));
		Console::Out("Listening on %s:%i (0/%i connections)", std::string(config["Host"]).c_str(), int(config["Port"]), server.MaxConnections());

		bool tables_exist = false;
		bool tried_install = false;

		while (!tables_exist)
		{
			bool try_install = false;

			try
			{
				Database_Result acc_count = server.world->db.Query("SELECT COUNT(1) AS `count` FROM `accounts`");
				Database_Result character_count = server.world->db.Query("SELECT COUNT(1) AS `count` FROM `characters`");
				Database_Result admin_character_count = server.world->db.Query("SELECT COUNT(1) AS `count` FROM `characters` WHERE `admin` > 0");
				Database_Result guild_count = server.world->db.Query("SELECT COUNT(1) AS `count` FROM `guilds`");
				Database_Result ban_count = server.world->db.Query("SELECT COUNT(1) AS `count` FROM `bans`");
				Database_Result ban_active_count = server.world->db.Query("SELECT COUNT(1) AS `count` FROM `bans` WHERE `expires` <= # AND `expires` <> 0", int(std::time(0)));
				Database_Result ban_perm_count = server.world->db.Query("SELECT COUNT(1) AS `count` FROM `bans` WHERE `expires` = 0");

				Console::Out("Database info:");
				Console::Out("  Accounts:   %i", int(acc_count.front()["count"]));
				Console::Out("  Characters: %i (%i staff)", int(character_count.front()["count"]), int(admin_character_count.front()["count"]));
				Console::Out("  Guilds:     %i", int(guild_count.front()["count"]));
				Console::Out("  Bans:       %i (%i expired, %i permanent)", int(ban_count.front()["count"]), int(ban_active_count.front()["count"]), int(ban_perm_count.front()["count"]));

				server.world->UpdateAdminCount(int(admin_character_count.front()["count"]));

				tables_exist = true;
			}
			catch (Database_Exception &e)
			{
#ifdef DEBUG
				Console::Dbg("Install check: %s: %s", e.what(), e.error());
#endif // DEBUG

				if (tried_install)
				{
					Console::Err("Could not find or install tables.");
					Console::Err(e.error());
					std::exit(1);
				}

				try_install = true;
			}

			if (try_install)
			{
				tried_install = true;
				Console::Wrn("A required table is missing. Attempting to execute install.sql");

				try
				{
					server.world->CommitDB();
					server.world->db.ExecuteFile(config["InstallSQL"]);
					server.world->BeginDB();
				}
				catch (Database_Exception& e)
				{
					Console::Err("Could not install tables.");
					Console::Err(e.error());
					std::exit(1);
				}
			}
		}

		while (eoserv_running)
		{
			if (eoserv_sig_abort)
			{
				Console::Out("Exiting EOSERV");
				eoserv_sig_abort = false;
				break;
			}

			if (eoserv_sig_rehash)
			{
				Console::Out("Reloading config");

				std::string old_logerr = config["LogErr"];
				std::string old_logout = config["LogOut"];

				eoserv_sig_rehash = false;
				server.world->Rehash();

				// Does not support changing from file logging back to '-'
				{
					std::time_t rawtime;
					char timestr[256];
					std::time(&rawtime);
					std::strftime(timestr, 256, "%c", std::localtime(&rawtime));

					std::string logerr = config["LogErr"];
					if (!logerr.empty() && logerr.compare("-") != 0)
					{
						if (logerr != old_logerr)
							Console::Out("Redirecting errors to '%s'...", logerr.c_str());

						if (!std::freopen(logerr.c_str(), "a", stderr))
						{
							Console::Err("Failed to redirect errors.");
						}
						else
						{
							Console::Styled[Console::STREAM_ERR] = false;
							std::fprintf(stderr, "\n\n--- %s ---\n\n", timestr);
						}

						if (std::setvbuf(stderr, 0, _IONBF, BUFSIZ) != 0)
						{
							Console::Wrn("Failed to change stderr buffer settings");
						}
					}

					std::string logout = config["LogOut"];
					if (!logout.empty() && logout.compare("-") != 0)
					{
						if (logout != old_logout)
							Console::Out("Redirecting output to '%s'...", logout.c_str());

						if (!std::freopen(logout.c_str(), "a", stdout))
						{
							Console::Err("Failed to redirect output.");
						}
						else
						{
							Console::Styled[Console::STREAM_OUT] = false;
							std::printf("\n\n--- %s ---\n\n", timestr);
						}

						if (std::setvbuf(stdout, 0, _IONBF, BUFSIZ) != 0)
						{
							Console::Wrn("Failed to change stdout buffer settings");
						}
					}
				}

				Console::Out("Config reloaded");
			}

			server.Tick();
		}
#ifndef DEBUG_EXCEPTIONS
	}
	catch (Socket_Exception &e)
	{
		Console::Err("%s: %s", e.what(), e.error());
		return 1;
	}
	catch (Database_Exception &e)
	{
		Console::Err("%s: %s", e.what(), e.error());
		return 1;
	}
	catch (std::runtime_error &e)
	{
		Console::Err("Runtime Error: %s", e.what());
		return 1;
	}
	catch (std::logic_error &e)
	{
		Console::Err("Logic Error: %s", e.what());
		return 1;
	}
	catch (std::exception &e)
	{
		Console::Err("Uncaught Exception: %s", e.what());
		return 1;
	}
	catch (...)
	{
		Console::Err("Uncaught Exception");
		return 1;
	}
#endif // DEBUG_EXCEPTIONS

#ifdef WIN32
	::SetEvent(eoserv_close_event);
#endif // WIN32

	return 0;
}